

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFNameTreeObjectHelper::Members::Members
          (Members *this,QPDFObjectHandle *oh,QPDF *q,bool auto_repair)

{
  bool auto_repair_local;
  QPDF *q_local;
  QPDFObjectHandle *oh_local;
  Members *this_local;
  
  std::make_shared<NNTreeImpl,(anonymous_namespace)::NameTreeDetails&,QPDF&,QPDFObjectHandle&,bool&>
            ((NameTreeDetails *)this,(QPDF *)&name_tree_details,(QPDFObjectHandle *)q,(bool *)oh);
  return;
}

Assistant:

QPDFNameTreeObjectHelper::Members::Members(QPDFObjectHandle& oh, QPDF& q, bool auto_repair) :
    impl(std::make_shared<NNTreeImpl>(name_tree_details, q, oh, auto_repair))
{
}